

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::CreateObject
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phObject,int op)

{
  SessionObjectStore *this_00;
  HandleManager *this_01;
  void *pvVar1;
  CK_BBOOL CVar2;
  CK_BBOOL CVar3;
  P11Object *this_02;
  CK_OBJECT_CLASS CVar4;
  char cVar5;
  int iVar6;
  Session *this_03;
  CK_RV CVar7;
  CK_STATE sessionState;
  SessionObject *pSVar8;
  CK_SLOT_ID CVar9;
  CK_OBJECT_HANDLE CVar10;
  CK_ULONG ulAttributeCount;
  CK_ATTRIBUTE *pCVar11;
  long lVar12;
  bool bVar13;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  SessionObject *local_860;
  Token *local_858;
  Slot *local_850;
  CK_SESSION_HANDLE local_848;
  CK_OBJECT_HANDLE *local_840;
  P11Object *p11object;
  CK_CERTIFICATE_TYPE certType;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  OSAttribute local_818;
  OSAttribute local_778;
  OSAttribute local_6d8;
  CK_ATTRIBUTE attribs [32];
  CK_ATTRIBUTE saveAttribs [32];
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (phObject == (CK_OBJECT_HANDLE_PTR)0x0 || pTemplate == (CK_ATTRIBUTE_PTR)0x0) {
    return 7;
  }
  local_848 = hSession;
  local_840 = phObject;
  this_03 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_03 == (Session *)0x0) {
    return 0xb3;
  }
  local_850 = Session::getSlot(this_03);
  if (local_850 == (Slot *)0x0) {
    return 5;
  }
  local_858 = Session::getToken(this_03);
  if (local_858 == (Token *)0x0) {
    return 5;
  }
  objClass = 0;
  keyType = 0;
  certType = 0;
  isOnToken = '\0';
  isPrivate = '\x01';
  CVar7 = extractObjectInformation
                    (pTemplate,ulCount,&objClass,&keyType,&certType,&isOnToken,&isPrivate,false);
  if (CVar7 != 0) {
    softHSMLog(3,"CreateObject",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x2e96,"Mandatory attribute not present in template");
    return CVar7;
  }
  sessionState = Session::getState(this_03);
  CVar3 = isOnToken;
  CVar2 = isPrivate;
  CVar7 = haveWrite(sessionState,isOnToken,isPrivate);
  if (CVar7 != 0) {
    if (CVar7 == 0xb5) {
      softHSMLog(6,"CreateObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x2ea1,"Session is read-only");
      return 0xb5;
    }
    if (CVar7 == 0x101) {
      softHSMLog(6,"CreateObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x2e9f,"User is not authorized");
      return 0x101;
    }
    return CVar7;
  }
  if (0x20 < ulCount) {
    return 0xd1;
  }
  if (ulCount == 0) {
    ulAttributeCount = 0;
  }
  else {
    lVar12 = 0;
    ulAttributeCount = 0;
    do {
      bVar13 = pTemplate->type == 0x90;
      pCVar11 = attribs + ulAttributeCount;
      if (bVar13) {
        pCVar11 = saveAttribs + lVar12;
      }
      ulAttributeCount = !bVar13 + ulAttributeCount;
      lVar12 = (ulong)bVar13 + lVar12;
      pCVar11->ulValueLen = pTemplate->ulValueLen;
      pvVar1 = pTemplate->pValue;
      pCVar11->type = pTemplate->type;
      pCVar11->pValue = pvVar1;
      pTemplate = pTemplate + 1;
      ulCount = ulCount - 1;
    } while (ulCount != 0);
    if (lVar12 != 0) {
      memcpy(attribs + ulAttributeCount,saveAttribs,lVar12 * 0x18);
      ulAttributeCount = ulAttributeCount + lVar12;
    }
  }
  CVar4 = objClass;
  p11object = (P11Object *)0x0;
  CVar7 = newP11Object(objClass,keyType,certType,&p11object);
  if (CVar7 != 0) {
    return CVar7;
  }
  if (CVar3 == '\0') {
    this_00 = this->sessionObjectStore;
    CVar9 = Slot::getSlotID(local_850);
    pSVar8 = SessionObjectStore::createObject(this_00,CVar9,local_848,CVar2 != '\0');
  }
  else {
    pSVar8 = (SessionObject *)Token::createObject(local_858);
  }
  this_02 = p11object;
  if (pSVar8 == (SessionObject *)0x0) {
    if (p11object == (P11Object *)0x0) {
      return 5;
    }
LAB_0012e470:
    (*this_02->_vptr_P11Object[1])(this_02);
    return 5;
  }
  iVar6 = (*p11object->_vptr_P11Object[2])(p11object,pSVar8);
  if ((char)iVar6 == '\0') goto LAB_0012e470;
  local_860 = pSVar8;
  CVar7 = P11Object::saveTemplate(this_02,local_858,CVar2 != '\0',attribs,ulAttributeCount,op);
  (*this_02->_vptr_P11Object[1])(this_02);
  if (CVar7 != 0) {
    return CVar7;
  }
  if (op != 2) goto LAB_0012e565;
  if (CVar4 != 2) {
    if (1 < CVar4 - 3) goto LAB_0012e565;
    iVar6 = (*(local_860->super_OSObject)._vptr_OSObject[0xb])();
    if ((char)iVar6 == '\0') {
      return 5;
    }
    OSAttribute::OSAttribute(&local_818,false);
    iVar6 = (*(local_860->super_OSObject)._vptr_OSObject[8])(local_860,0x163,&local_818);
    if ((char)iVar6 == '\0') goto LAB_0012e5e5;
    OSAttribute::OSAttribute(&local_778,false);
    iVar6 = (*(local_860->super_OSObject)._vptr_OSObject[8])(local_860,0x165,&local_778);
    if ((char)iVar6 != '\0') {
      OSAttribute::OSAttribute(&local_6d8,false);
      iVar6 = (*(local_860->super_OSObject)._vptr_OSObject[8])(local_860,0x164,&local_6d8);
      if ((char)iVar6 != '\0') {
        iVar6 = (*(local_860->super_OSObject)._vptr_OSObject[0xc])();
        cVar5 = (char)iVar6;
        OSAttribute::~OSAttribute(&local_6d8);
        OSAttribute::~OSAttribute(&local_778);
        goto LAB_0012e454;
      }
      OSAttribute::~OSAttribute(&local_6d8);
    }
    OSAttribute::~OSAttribute(&local_778);
LAB_0012e5e5:
    OSAttribute::~OSAttribute(&local_818);
    return 5;
  }
  iVar6 = (*(local_860->super_OSObject)._vptr_OSObject[0xb])();
  if ((char)iVar6 == '\0') {
    return 5;
  }
  OSAttribute::OSAttribute(&local_818,false);
  iVar6 = (*(local_860->super_OSObject)._vptr_OSObject[8])(local_860,0x163,&local_818);
  if ((char)iVar6 == '\0') goto LAB_0012e5e5;
  iVar6 = (*(local_860->super_OSObject)._vptr_OSObject[0xc])();
  cVar5 = (char)iVar6;
LAB_0012e454:
  OSAttribute::~OSAttribute(&local_818);
  if (cVar5 == '\0') {
    return 5;
  }
LAB_0012e565:
  this_01 = this->handleManager;
  CVar9 = Slot::getSlotID(local_850);
  if (CVar3 == '\0') {
    CVar10 = HandleManager::addSessionObject(this_01,CVar9,local_848,CVar2 != '\0',local_860);
  }
  else {
    CVar10 = HandleManager::addTokenObject(this_01,CVar9,CVar2 != '\0',local_860);
  }
  *local_840 = CVar10;
  return 0;
}

Assistant:

CK_RV SoftHSM::CreateObject(CK_SESSION_HANDLE hSession, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount, CK_OBJECT_HANDLE_PTR phObject, int op)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (phObject == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the slot
	Slot* slot = session->getSlot();
	if (slot == NULL_PTR) return CKR_GENERAL_ERROR;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Extract information from the template that is needed to create the object.
	CK_OBJECT_CLASS objClass = CKO_DATA;
	CK_KEY_TYPE keyType = CKK_RSA;
	CK_CERTIFICATE_TYPE certType = CKC_X_509;
	CK_BBOOL isOnToken = CK_FALSE;
	CK_BBOOL isPrivate = CK_TRUE;
	bool isImplicit = false;
	CK_RV rv = extractObjectInformation(pTemplate,ulCount,objClass,keyType,certType, isOnToken, isPrivate, isImplicit);
	if (rv != CKR_OK)
	{
		ERROR_MSG("Mandatory attribute not present in template");
		return rv;
	}

	// Check user credentials
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Change order of attributes
	const CK_ULONG maxAttribs = 32;
	CK_ATTRIBUTE attribs[maxAttribs];
	CK_ATTRIBUTE saveAttribs[maxAttribs];
	CK_ULONG attribsCount = 0;
	CK_ULONG saveAttribsCount = 0;
	if (ulCount > maxAttribs)
	{
		return CKR_TEMPLATE_INCONSISTENT;
	}
	for (CK_ULONG i=0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CHECK_VALUE:
				saveAttribs[saveAttribsCount++] = pTemplate[i];
				break;
			default:
				attribs[attribsCount++] = pTemplate[i];
		}
	}
	for (CK_ULONG i=0; i < saveAttribsCount; i++)
	{
		attribs[attribsCount++] = saveAttribs[i];
	}

	P11Object* p11object = NULL;
	rv = newP11Object(objClass,keyType,certType,&p11object);
	if (rv != CKR_OK)
		return rv;

	// Create the object in session or on the token
	OSObject *object = NULL_PTR;
	if (isOnToken)
	{
		object = (OSObject*) token->createObject();
	}
	else
	{
		object = sessionObjectStore->createObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE);
	}

	if (object == NULL || !p11object->init(object))
	{
		delete p11object;
		return CKR_GENERAL_ERROR;
	}

	rv = p11object->saveTemplate(token, isPrivate != CK_FALSE, attribs,attribsCount,op);
	delete p11object;
	if (rv != CKR_OK)
		return rv;

	if (op == OBJECT_OP_CREATE)
	{
		if (objClass == CKO_PUBLIC_KEY &&
		    (!object->startTransaction() ||
		    !object->setAttribute(CKA_LOCAL, false) ||
		    !object->commitTransaction()))
		{
			return CKR_GENERAL_ERROR;
		}

		if ((objClass == CKO_SECRET_KEY || objClass == CKO_PRIVATE_KEY) &&
		    (!object->startTransaction() ||
		    !object->setAttribute(CKA_LOCAL, false) ||
		    !object->setAttribute(CKA_ALWAYS_SENSITIVE, false) ||
		    !object->setAttribute(CKA_NEVER_EXTRACTABLE, false) ||
		    !object->commitTransaction()))
		{
			return CKR_GENERAL_ERROR;
		}
	}

	if (isOnToken)
	{
		*phObject = handleManager->addTokenObject(slot->getSlotID(), isPrivate != CK_FALSE, object);
	} else {
		*phObject = handleManager->addSessionObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE, object);
	}

	return CKR_OK;
}